

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void GetRequestHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char *pcVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  mapped_type *ppAVar5;
  ulong uVar6;
  ostream *this;
  CMConnection conn_00;
  _GetRequestMsg **pp_Var7;
  AnonADIOSFile *in_RCX;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  exception *exc;
  DataType TypeOfVar;
  string VarName;
  Remote_evpath_state *ev_state;
  AnonADIOSFile *f;
  GetRequestMsg GetMsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
  *in_stack_fffffffffffffc90;
  AnonADIOSFile *in_stack_fffffffffffffdf0;
  AnonADIOSFile *pAVar8;
  undefined8 in_stack_fffffffffffffdf8;
  DataType DVar9;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  GetRequestMsg *in_stack_fffffffffffffe08;
  Remote_evpath_state *in_stack_fffffffffffffe10;
  CMConnection in_stack_fffffffffffffe18;
  allocator local_71;
  string local_70 [32];
  rep local_50;
  AnonADIOSFile *local_48;
  undefined8 local_40;
  mapped_type local_38;
  long local_30;
  AnonADIOSFile *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_40 = *(undefined8 *)(in_RDX + 8);
  local_30 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  ppAVar5 = std::
            unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
            ::operator[](in_stack_fffffffffffffc90,(key_type *)in_stack_fffffffffffffc88);
  local_38 = *ppAVar5;
  local_48 = local_20;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  DVar9 = (DataType)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_50 = (rep)last_service_time.__d.__r;
  if (local_38->m_mode == RemoteOpen) {
    if (local_38->currentStep == -1) {
      adios2::core::Engine::BeginStep();
      local_38->currentStep = local_38->currentStep + 1;
    }
    while( true ) {
      uVar6 = (**(code **)(*(long *)local_38->m_engine + 0x20))();
      DVar9 = (DataType)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (*(ulong *)(local_30 + 0x18) <= uVar6) break;
      if (1 < verbose) {
        this = std::operator<<((ostream *)&std::cout,"Advancing a step");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      (**(code **)(*(long *)local_38->m_engine + 0x28))();
      adios2::core::Engine::BeginStep();
      local_38->currentStep = local_38->currentStep + 1;
    }
  }
  pcVar1 = *(char **)(local_30 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  DVar2 = adios2::core::IO::InquireVariableType((string *)local_38->m_io);
  if (DVar2 != None) {
    DVar3 = adios2::helper::GetDataType<char>();
    if (DVar2 == DVar3) {
      std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                ((_GetRequestMsg **)in_stack_fffffffffffffc88);
      std::reference_wrapper::operator_cast_to__GetRequestMsg__
                ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)0x116f4e);
      std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
      std::reference_wrapper::operator_cast_to_string_
                ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x116f78);
      PrepareResponseForGet<char>
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),DVar9,
                 in_stack_fffffffffffffdf0);
    }
    else {
      DVar3 = adios2::helper::GetDataType<signed_char>();
      if (DVar2 == DVar3) {
        pAVar8 = local_48;
        std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                  ((_GetRequestMsg **)in_stack_fffffffffffffc88);
        conn_00 = (CMConnection)
                  std::reference_wrapper::operator_cast_to__GetRequestMsg__
                            ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)
                             0x11715a);
        std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
        std::reference_wrapper::operator_cast_to_string_
                  ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x117184);
        PrepareResponseForGet<signed_char>
                  (conn_00,(Remote_evpath_state *)pAVar8,(GetRequestMsg *)local_10,
                   (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),DVar9,
                   in_stack_fffffffffffffdf0);
      }
      else {
        DVar3 = DVar2;
        DVar4 = adios2::helper::GetDataType<short>();
        if (DVar3 == DVar4) {
          pAVar8 = local_48;
          std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                    ((_GetRequestMsg **)in_stack_fffffffffffffc88);
          pp_Var7 = std::reference_wrapper::operator_cast_to__GetRequestMsg__
                              ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)
                               0x117221);
          DVar9 = (DataType)((ulong)pp_Var7 >> 0x20);
          std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
          std::reference_wrapper::operator_cast_to_string_
                    ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x11724b);
          PrepareResponseForGet<short>
                    (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                     (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,pAVar8);
        }
        else {
          DVar4 = adios2::helper::GetDataType<int>();
          if (DVar2 == DVar4) {
            std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                      ((_GetRequestMsg **)in_stack_fffffffffffffc88);
            std::reference_wrapper::operator_cast_to__GetRequestMsg__
                      ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)0x1172e8);
            std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
            std::reference_wrapper::operator_cast_to_string_
                      ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x117312);
            PrepareResponseForGet<int>
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
                       ,(string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                       in_stack_fffffffffffffdf0);
          }
          else {
            DVar4 = adios2::helper::GetDataType<long>();
            if (DVar2 == DVar4) {
              std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                        ((_GetRequestMsg **)in_stack_fffffffffffffc88);
              std::reference_wrapper::operator_cast_to__GetRequestMsg__
                        ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)0x1173af
                        );
              std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
              std::reference_wrapper::operator_cast_to_string_
                        ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1173d9);
              PrepareResponseForGet<long>
                        (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffe08,
                         (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                         in_stack_fffffffffffffdf0);
            }
            else {
              DVar4 = adios2::helper::GetDataType<unsigned_char>();
              if (DVar2 == DVar4) {
                std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                          ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                std::reference_wrapper::operator_cast_to__GetRequestMsg__
                          ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)
                           0x117476);
                std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                std::reference_wrapper::operator_cast_to_string_
                          ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x1174a0);
                PrepareResponseForGet<unsigned_char>
                          (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08,
                           (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                           in_stack_fffffffffffffdf0);
              }
              else {
                DVar4 = adios2::helper::GetDataType<unsigned_short>();
                if (DVar2 == DVar4) {
                  std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                            ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                  std::reference_wrapper::operator_cast_to__GetRequestMsg__
                            ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)
                             0x11753d);
                  std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                  std::reference_wrapper::operator_cast_to_string_
                            ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x117567);
                  PrepareResponseForGet<unsigned_short>
                            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                             in_stack_fffffffffffffe08,
                             (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                             in_stack_fffffffffffffdf0);
                }
                else {
                  DVar4 = adios2::helper::GetDataType<unsigned_int>();
                  if (DVar2 == DVar4) {
                    std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                              ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                    std::reference_wrapper::operator_cast_to__GetRequestMsg__
                              ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)
                               0x117604);
                    std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                    std::reference_wrapper::operator_cast_to_string_
                              ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x11762e);
                    PrepareResponseForGet<unsigned_int>
                              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                               in_stack_fffffffffffffe08,
                               (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                               in_stack_fffffffffffffdf0);
                  }
                  else {
                    DVar4 = adios2::helper::GetDataType<unsigned_long>();
                    if (DVar2 == DVar4) {
                      std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                                ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                      std::reference_wrapper::operator_cast_to__GetRequestMsg__
                                ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*> *)
                                 0x1176cb);
                      std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                      std::reference_wrapper::operator_cast_to_string_
                                ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x1176f5);
                      PrepareResponseForGet<unsigned_long>
                                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                 in_stack_fffffffffffffe08,
                                 (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                                 in_stack_fffffffffffffdf0);
                    }
                    else {
                      DVar4 = adios2::helper::GetDataType<float>();
                      if (DVar2 == DVar4) {
                        std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                                  ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                        std::reference_wrapper::operator_cast_to__GetRequestMsg__
                                  ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*>
                                    *)0x117792);
                        std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                        std::reference_wrapper::operator_cast_to_string_
                                  ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)0x1177bc);
                        PrepareResponseForGet<float>
                                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                   in_stack_fffffffffffffe08,
                                   (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                                   in_stack_fffffffffffffdf0);
                      }
                      else {
                        DVar4 = adios2::helper::GetDataType<double>();
                        if (DVar2 == DVar4) {
                          std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                                    ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                          std::reference_wrapper::operator_cast_to__GetRequestMsg__
                                    ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*>
                                      *)0x11784d);
                          std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                          std::reference_wrapper::operator_cast_to_string_
                                    ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)0x117874);
                          PrepareResponseForGet<double>
                                    (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                     in_stack_fffffffffffffe08,
                                     (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                                     in_stack_fffffffffffffdf0);
                        }
                        else {
                          DVar4 = adios2::helper::GetDataType<long_double>();
                          if (DVar2 == DVar4) {
                            std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                                      ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                            std::reference_wrapper::operator_cast_to__GetRequestMsg__
                                      ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*>
                                        *)0x1178fc);
                            std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                            std::reference_wrapper::operator_cast_to_string_
                                      ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)0x117923);
                            PrepareResponseForGet<long_double>
                                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                       in_stack_fffffffffffffe08,
                                       (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                                       in_stack_fffffffffffffdf0);
                          }
                          else {
                            DVar4 = adios2::helper::GetDataType<std::complex<float>>();
                            if (DVar2 == DVar4) {
                              std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                                        ((_GetRequestMsg **)in_stack_fffffffffffffc88);
                              std::reference_wrapper::operator_cast_to__GetRequestMsg__
                                        ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*>
                                          *)0x1179ab);
                              std::ref<std::__cxx11::string>(in_stack_fffffffffffffc88);
                              std::reference_wrapper::operator_cast_to_string_
                                        ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)0x1179d2);
                              PrepareResponseForGet<std::complex<float>>
                                        (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                         in_stack_fffffffffffffe08,
                                         (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9,
                                         in_stack_fffffffffffffdf0);
                            }
                            else {
                              DVar4 = adios2::helper::GetDataType<std::complex<double>>();
                              if (DVar2 == DVar4) {
                                std::ref<adios2::EVPathRemoteCommon::_GetRequestMsg*>
                                          ((_GetRequestMsg **)local_10);
                                std::reference_wrapper::operator_cast_to__GetRequestMsg__
                                          ((reference_wrapper<adios2::EVPathRemoteCommon::_GetRequestMsg_*>
                                            *)0x117a59);
                                std::ref<std::__cxx11::string>(local_10);
                                std::reference_wrapper::operator_cast_to_string_
                                          ((reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)0x117a80);
                                PrepareResponseForGet<std::complex<double>>
                                          (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                           in_stack_fffffffffffffe08,
                                           (string *)CONCAT44(DVar3,in_stack_fffffffffffffe00),DVar9
                                           ,in_stack_fffffffffffffdf0);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

static void GetRequestHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    GetRequestMsg GetMsg = static_cast<GetRequestMsg>(vevent);
    AnonADIOSFile *f = ADIOSFileMap[GetMsg->FileHandle];
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    last_service_time = std::chrono::steady_clock::now();
    if (f->m_mode == RemoteOpen)
    {
        if (f->currentStep == -1)
        {
            f->m_engine->BeginStep();
            f->currentStep++;
        }
        while (f->m_engine->CurrentStep() < GetMsg->Step)
        {
            if (verbose >= 2)
                std::cout << "Advancing a step" << std::endl;
            f->m_engine->EndStep();
            f->m_engine->BeginStep();
            f->currentStep++;
        }
    }

    std::string VarName = std::string(GetMsg->VarName);
    adios2::DataType TypeOfVar = f->m_io->InquireVariableType(VarName);

    try
    {
        if (TypeOfVar == adios2::DataType::None)
        {
        }
#define GET(T)                                                                                     \
    else if (TypeOfVar == helper::GetDataType<T>())                                                \
    {                                                                                              \
        PrepareResponseForGet<T>(conn, ev_state, std::ref(GetMsg), std::ref(VarName), TypeOfVar,   \
                                 f);                                                               \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(GET)
#undef GET
    }
    catch (const std::exception &exc)
    {
        if (verbose)
            std::cout << "Returning exception " << exc.what() << " for Get<" << TypeOfVar << ">("
                      << VarName << ")" << std::endl;
    }
}